

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O1

long vorbis_book_decodev_set(codebook *book,ogg_int32_t *a,oggpack_buffer *b,int n,int point)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  long lVar4;
  ogg_int32_t *poVar5;
  int iVar6;
  
  if (book->used_entries < 1) {
    if (0 < n) {
      lVar2 = book->dim;
      iVar6 = 0;
      do {
        if (0 < lVar2) {
          poVar5 = a + iVar6;
          do {
            *poVar5 = 0;
            poVar5 = poVar5 + 1;
            iVar6 = iVar6 + 1;
          } while (0 < lVar2);
        }
      } while (iVar6 < n);
      return 0;
    }
    return 0;
  }
  iVar6 = point - book->binarypoint;
  bVar3 = (byte)iVar6;
  if (iVar6 < 0) {
    if (n < 1) {
      return 0;
    }
    iVar6 = 0;
    do {
      lVar2 = decode_packed_entry_number(book,b);
      if ((int)lVar2 == -1) {
        return -1;
      }
      lVar1 = book->dim;
      if (0 < lVar1) {
        poVar5 = book->valuelist;
        lVar4 = 0;
        do {
          a[iVar6 + lVar4] = poVar5[(int)lVar2 * lVar1 + lVar4] << (-bVar3 & 0x1f);
          lVar4 = lVar4 + 1;
        } while (lVar1 != lVar4);
        iVar6 = iVar6 + (int)lVar4;
      }
    } while (iVar6 < n);
  }
  else {
    if (n < 1) {
      return 0;
    }
    iVar6 = 0;
    do {
      lVar2 = decode_packed_entry_number(book,b);
      if ((int)lVar2 == -1) {
        return -1;
      }
      lVar1 = book->dim;
      if (0 < lVar1) {
        poVar5 = book->valuelist;
        lVar4 = 0;
        do {
          a[iVar6 + lVar4] = poVar5[(int)lVar2 * lVar1 + lVar4] >> (bVar3 & 0x1f);
          lVar4 = lVar4 + 1;
        } while (lVar1 != lVar4);
        iVar6 = iVar6 + (int)lVar4;
      }
    } while (iVar6 < n);
  }
  return 0;
}

Assistant:

long vorbis_book_decodev_set(codebook *book,ogg_int32_t *a,
			     oggpack_buffer *b,int n,int point){
  if(book->used_entries>0){
    int i,j,entry;
    ogg_int32_t *t;
    int shift=point-book->binarypoint;
    
    if(shift>=0){
      
      for(i=0;i<n;){
	entry = decode_packed_entry_number(book,b);
	if(entry==-1)return(-1);
	t     = book->valuelist+entry*book->dim;
	for (j=0;j<book->dim;){
	  a[i++]=t[j++]>>shift;
	}
      }
    }else{
      
      for(i=0;i<n;){
	entry = decode_packed_entry_number(book,b);
	if(entry==-1)return(-1);
	t     = book->valuelist+entry*book->dim;
	for (j=0;j<book->dim;){
	  a[i++]=t[j++]<<-shift;
	}
      }
    }
  }else{

    int i,j;
    for(i=0;i<n;){
      for (j=0;j<book->dim;){
	a[i++]=0;
      }
    }
  }
  return(0);
}